

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O3

void __thiscall
ctemplate::JsonEscape::Modify
          (JsonEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  byte bVar1;
  long lVar2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  
  if ((long)inlen < 1) {
    return;
  }
  pcVar7 = in + inlen;
LAB_0012bb86:
  lVar5 = 0;
  do {
    bVar1 = in[lVar5];
    if (bVar1 < 0x22) {
      switch(bVar1) {
      case 8:
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 2;
        pcVar6 = "\\b";
        goto LAB_0012bde9;
      case 9:
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 2;
        pcVar6 = "\\t";
        goto LAB_0012bde9;
      case 10:
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 2;
        pcVar6 = "\\n";
        goto LAB_0012bde9;
      case 0xc:
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 2;
        pcVar6 = "\\f";
        goto LAB_0012bde9;
      case 0xd:
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 2;
        pcVar6 = "\\r";
        goto LAB_0012bde9;
      }
    }
    else if (bVar1 < 0x3c) {
      if (bVar1 == 0x22) {
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 2;
        pcVar6 = "\\\"";
        goto LAB_0012bde9;
      }
      if (bVar1 == 0x26) {
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 6;
        pcVar6 = "\\u0026";
        goto LAB_0012bde9;
      }
      if (bVar1 == 0x2f) break;
    }
    else {
      if (bVar1 == 0x3c) {
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 6;
        pcVar6 = "\\u003C";
        goto LAB_0012bde9;
      }
      if (bVar1 == 0x3e) {
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 6;
        pcVar6 = "\\u003E";
        goto LAB_0012bde9;
      }
      if (bVar1 == 0x5c) {
        if (in < in + lVar5) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var3 = out->_vptr_ExpandEmitter;
        uVar4 = 2;
        pcVar6 = "\\\\";
        goto LAB_0012bde9;
      }
    }
    lVar2 = lVar5 + 1;
    lVar5 = lVar5 + 1;
    if (pcVar7 <= in + lVar2) {
      if (in + lVar5 <= in) {
        return;
      }
      (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
      return;
    }
  } while( true );
  if (in < in + lVar5) {
    (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
  }
  pp_Var3 = out->_vptr_ExpandEmitter;
  uVar4 = 2;
  pcVar6 = "\\/";
LAB_0012bde9:
  (*pp_Var3[5])(out,pcVar6,uVar4);
  in = in + lVar5 + 1;
  if (pcVar7 <= in) {
    return;
  }
  goto LAB_0012bb86;
}

Assistant:

void JsonEscape::Modify(const char* in, size_t inlen,
                        const PerExpandData*,
                        ExpandEmitter* out, const string& arg) const {
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit) {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      case '"':  EmitRun(start, pos, out); APPEND("\\\"");    break;
      case '\\': EmitRun(start, pos, out); APPEND("\\\\");    break;
      case '/':  EmitRun(start, pos, out); APPEND("\\/");     break;
      case '\b': EmitRun(start, pos, out); APPEND("\\b");     break;
      case '\f': EmitRun(start, pos, out); APPEND("\\f");     break;
      case '\n': EmitRun(start, pos, out); APPEND("\\n");     break;
      case '\r': EmitRun(start, pos, out); APPEND("\\r");     break;
      case '\t': EmitRun(start, pos, out); APPEND("\\t");     break;
      case '&':  EmitRun(start, pos, out); APPEND("\\u0026"); break;
      case '<':  EmitRun(start, pos, out); APPEND("\\u003C"); break;
      case '>':  EmitRun(start, pos, out); APPEND("\\u003E"); break;
    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
}